

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O1

void ResizeNodeDistPages(void)

{
  int iVar1;
  NodeDist_t **ppNVar2;
  int iVar3;
  NodeDist_t **ppNVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  iVar3 = maxNodeDistPages;
  iVar1 = nodeDistPage;
  lVar7 = (long)nodeDistPage;
  uVar6 = nodeDistPage + 1;
  lVar8 = (long)maxNodeDistPages;
  nodeDistPage = uVar6;
  ppNVar4 = nodeDistPages;
  if (uVar6 == maxNodeDistPages) {
    ppNVar4 = (NodeDist_t **)malloc(lVar8 * 8 + 0x400);
    ppNVar2 = nodeDistPages;
    if (ppNVar4 == (NodeDist_t **)0x0) {
      ppNVar4 = nodeDistPages;
      if (-1 < iVar1) {
        uVar9 = 0;
        do {
          if (ppNVar2[uVar9] != (NodeDist_t *)0x0) {
            free(ppNVar2[uVar9]);
            ppNVar2[uVar9] = (NodeDist_t *)0x0;
          }
          uVar9 = uVar9 + 1;
          ppNVar4 = nodeDistPages;
        } while (uVar6 != uVar9);
      }
      goto joined_r0x007930d7;
    }
    maxNodeDistPages = iVar3 + 0x80;
    if (0 < iVar3) {
      lVar5 = 0;
      do {
        ppNVar4[lVar5] = ppNVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar8 != lVar5);
    }
    if (nodeDistPages != (NodeDist_t **)0x0) {
      free(nodeDistPages);
    }
  }
  nodeDistPages = ppNVar4;
  currentNodeDistPage = (NodeDist_t *)malloc(0x10000);
  ppNVar4 = nodeDistPages;
  nodeDistPages[lVar7 + 1] = currentNodeDistPage;
  if (currentNodeDistPage != (NodeDist_t *)0x0) {
    nodeDistPageIndex = 0;
    return;
  }
  currentNodeDistPage = (NodeDist_t *)0x0;
  if (-1 < iVar1) {
    uVar9 = 0;
    do {
      if (ppNVar4[uVar9] != (NodeDist_t *)0x0) {
        free(ppNVar4[uVar9]);
        ppNVar4[uVar9] = (NodeDist_t *)0x0;
      }
      uVar9 = uVar9 + 1;
    } while (uVar6 != uVar9);
  }
joined_r0x007930d7:
  if (ppNVar4 != (NodeDist_t **)0x0) {
    free(ppNVar4);
    nodeDistPages = (NodeDist_t **)0x0;
  }
  memOut = 1;
  return;
}

Assistant:

static void
ResizeNodeDistPages(void)
{
    int i;
    NodeDist_t **newNodeDistPages;

    /* move to next page */
    nodeDistPage++;

    /* If the current page index is larger than the number of pages
     * allocated, allocate a new page array. Page numbers are incremented by
     * INITIAL_PAGES
     */
    if (nodeDistPage == maxNodeDistPages) {
        newNodeDistPages = ABC_ALLOC(NodeDist_t *,maxNodeDistPages + INITIAL_PAGES);
        if (newNodeDistPages == NULL) {
            for (i = 0; i < nodeDistPage; i++) ABC_FREE(nodeDistPages[i]);
            ABC_FREE(nodeDistPages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxNodeDistPages; i++) {
                newNodeDistPages[i] = nodeDistPages[i];
            }
            /* Increase total page count */
            maxNodeDistPages += INITIAL_PAGES;
            ABC_FREE(nodeDistPages);
            nodeDistPages = newNodeDistPages;
        }
    }
    /* Allocate a new page */
    currentNodeDistPage = nodeDistPages[nodeDistPage] = ABC_ALLOC(NodeDist_t,
                                                              nodeDistPageSize);
    if (currentNodeDistPage == NULL) {
        for (i = 0; i < nodeDistPage; i++) ABC_FREE(nodeDistPages[i]);
        ABC_FREE(nodeDistPages);
        memOut = 1;
        return;
    }
    /* reset page index */
    nodeDistPageIndex = 0;
    return;

}